

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearList.cpp
# Opt level: O0

void printout(LinearList *L)

{
  ostream *this;
  char *pcVar1;
  int local_14;
  int i;
  LinearList *L_local;
  
  for (local_14 = 0; local_14 < L->Last; local_14 = local_14 + 1) {
    pcVar1 = " ";
    if (local_14 == 0) {
      pcVar1 = "";
    }
    this = std::operator<<((ostream *)&std::cout,pcVar1);
    std::ostream::operator<<(this,L->data[local_14]);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printout(LinearList *L)  //打印线性表的表目
{
    int i;
    for(i = 0; i < L->Last; i++)
        cout << (i==0?"":" ") << L->data[i];
    cout << endl;
}